

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

bool sqlcheck::IsCreateStatement(string *sql_statement)

{
  long lVar1;
  size_t found;
  allocator local_39;
  string local_38 [8];
  string create_table_template;
  string *sql_statement_local;
  
  create_table_template.field_2._8_8_ = sql_statement;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"create table",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar1 = std::__cxx11::string::find((string *)create_table_template.field_2._8_8_,(ulong)local_38);
  std::__cxx11::string::~string(local_38);
  return lVar1 != -1;
}

Assistant:

bool IsCreateStatement(const std::string& sql_statement){
  std::string create_table_template = "create table";
  std::size_t found = sql_statement.find(create_table_template);
  if (found != std::string::npos) {
    return true;
  }

  return false;
}